

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ColumnMetaData * __thiscall
duckdb_parquet::ColumnMetaData::operator=(ColumnMetaData *this,ColumnMetaData *other125)

{
  int64_t iVar1;
  
  this->type = other125->type;
  std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>::
  operator=(&(this->encodings).
             super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
            ,&(other125->encodings).
              super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
           );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->path_in_schema,
              &(other125->path_in_schema).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  this->codec = other125->codec;
  iVar1 = other125->total_uncompressed_size;
  this->num_values = other125->num_values;
  this->total_uncompressed_size = iVar1;
  this->total_compressed_size = other125->total_compressed_size;
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::operator=
            (&(this->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
             &(other125->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>);
  iVar1 = other125->index_page_offset;
  this->data_page_offset = other125->data_page_offset;
  this->index_page_offset = iVar1;
  this->dictionary_page_offset = other125->dictionary_page_offset;
  Statistics::operator=(&this->statistics,&other125->statistics);
  std::vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
  ::operator=(&(this->encoding_stats).
               super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
              ,&(other125->encoding_stats).
                super_vector<duckdb_parquet::PageEncodingStats,_std::allocator<duckdb_parquet::PageEncodingStats>_>
             );
  this->bloom_filter_offset = other125->bloom_filter_offset;
  this->bloom_filter_length = other125->bloom_filter_length;
  (this->size_statistics).unencoded_byte_array_data_bytes =
       (other125->size_statistics).unencoded_byte_array_data_bytes;
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->size_statistics).repetition_level_histogram.
              super_vector<long,_std::allocator<long>_>,
             &(other125->size_statistics).repetition_level_histogram.
              super_vector<long,_std::allocator<long>_>);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->size_statistics).definition_level_histogram.
              super_vector<long,_std::allocator<long>_>,
             &(other125->size_statistics).definition_level_histogram.
              super_vector<long,_std::allocator<long>_>);
  (this->size_statistics).__isset = (other125->size_statistics).__isset;
  this->__isset = other125->__isset;
  return this;
}

Assistant:

ColumnMetaData& ColumnMetaData::operator=(const ColumnMetaData& other125) {
  type = other125.type;
  encodings = other125.encodings;
  path_in_schema = other125.path_in_schema;
  codec = other125.codec;
  num_values = other125.num_values;
  total_uncompressed_size = other125.total_uncompressed_size;
  total_compressed_size = other125.total_compressed_size;
  key_value_metadata = other125.key_value_metadata;
  data_page_offset = other125.data_page_offset;
  index_page_offset = other125.index_page_offset;
  dictionary_page_offset = other125.dictionary_page_offset;
  statistics = other125.statistics;
  encoding_stats = other125.encoding_stats;
  bloom_filter_offset = other125.bloom_filter_offset;
  bloom_filter_length = other125.bloom_filter_length;
  size_statistics = other125.size_statistics;
  __isset = other125.__isset;
  return *this;
}